

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pn06.c
# Opt level: O0

void iauPn06(double date1,double date2,double dpsi,double deps,double *epsa,double (*rb) [3],
            double (*rp) [3],double (*rbp) [3],double (*rn) [3],double (*rbpn) [3])

{
  undefined8 *in_RDI;
  double rt [3] [3];
  double r2 [3] [3];
  double r1 [3] [3];
  double eps;
  double psib;
  double phib;
  double gamb;
  double (*in_stack_fffffffffffffea8) [3];
  double (*in_stack_fffffffffffffeb0) [3];
  double *in_stack_fffffffffffffeb8;
  double *in_stack_fffffffffffffec0;
  double in_stack_fffffffffffffec8;
  double in_stack_fffffffffffffed0;
  double (*in_stack_fffffffffffffef8) [3];
  double (*in_stack_ffffffffffffff00) [3];
  double (*in_stack_ffffffffffffff08) [3];
  double (*in_stack_ffffffffffffff10) [3];
  undefined8 local_70;
  
  iauPfw06(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
           in_stack_fffffffffffffeb8,*in_stack_fffffffffffffeb0,*in_stack_fffffffffffffea8);
  iauFw2m((double)in_stack_fffffffffffffec0,(double)in_stack_fffffffffffffeb8,
          (double)in_stack_fffffffffffffeb0,(double)in_stack_fffffffffffffea8,
          (double (*) [3])0x119d91);
  iauCr(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  iauPfw06(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
           in_stack_fffffffffffffeb8,*in_stack_fffffffffffffeb0,*in_stack_fffffffffffffea8);
  iauFw2m((double)in_stack_fffffffffffffec0,(double)in_stack_fffffffffffffeb8,
          (double)in_stack_fffffffffffffeb0,(double)in_stack_fffffffffffffea8,
          (double (*) [3])0x119e0b);
  iauCr(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  iauTr(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  iauRxr(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  iauFw2m((double)in_stack_fffffffffffffec0,(double)in_stack_fffffffffffffeb8,
          (double)in_stack_fffffffffffffeb0,(double)in_stack_fffffffffffffea8,
          (double (*) [3])0x119e85);
  iauCr(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  iauTr(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  iauRxr(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  *in_RDI = local_70;
  return;
}

Assistant:

void iauPn06(double date1, double date2, double dpsi, double deps,
             double *epsa,
             double rb[3][3], double rp[3][3], double rbp[3][3],
             double rn[3][3], double rbpn[3][3])
/*
**  - - - - - - - -
**   i a u P n 0 6
**  - - - - - - - -
**
**  Precession-nutation, IAU 2006 model:  a multi-purpose function,
**  supporting classical (equinox-based) use directly and CIO-based use
**  indirectly.
**
**  This function is part of the International Astronomical Union's
**  SOFA (Standards Of Fundamental Astronomy) software collection.
**
**  Status:  support function.
**
**  Given:
**     date1,date2  double          TT as a 2-part Julian Date (Note 1)
**     dpsi,deps    double          nutation (Note 2)
**
**  Returned:
**     epsa         double          mean obliquity (Note 3)
**     rb           double[3][3]    frame bias matrix (Note 4)
**     rp           double[3][3]    precession matrix (Note 5)
**     rbp          double[3][3]    bias-precession matrix (Note 6)
**     rn           double[3][3]    nutation matrix (Note 7)
**     rbpn         double[3][3]    GCRS-to-true matrix (Notes 8,9)
**
**  Notes:
**
**  1)  The TT date date1+date2 is a Julian Date, apportioned in any
**      convenient way between the two arguments.  For example,
**      JD(TT)=2450123.7 could be expressed in any of these ways,
**      among others:
**
**             date1          date2
**
**          2450123.7           0.0       (JD method)
**          2451545.0       -1421.3       (J2000 method)
**          2400000.5       50123.2       (MJD method)
**          2450123.5           0.2       (date & time method)
**
**      The JD method is the most natural and convenient to use in
**      cases where the loss of several decimal digits of resolution
**      is acceptable.  The J2000 method is best matched to the way
**      the argument is handled internally and will deliver the
**      optimum resolution.  The MJD method and the date & time methods
**      are both good compromises between resolution and convenience.
**
**  2)  The caller is responsible for providing the nutation components;
**      they are in longitude and obliquity, in radians and are with
**      respect to the equinox and ecliptic of date.  For high-accuracy
**      applications, free core nutation should be included as well as
**      any other relevant corrections to the position of the CIP.
**
**  3)  The returned mean obliquity is consistent with the IAU 2006
**      precession.
**
**  4)  The matrix rb transforms vectors from GCRS to J2000.0 mean
**      equator and equinox by applying frame bias.
**
**  5)  The matrix rp transforms vectors from J2000.0 mean equator and
**      equinox to mean equator and equinox of date by applying
**      precession.
**
**  6)  The matrix rbp transforms vectors from GCRS to mean equator and
**      equinox of date by applying frame bias then precession.  It is
**      the product rp x rb.
**
**  7)  The matrix rn transforms vectors from mean equator and equinox
**      of date to true equator and equinox of date by applying the
**      nutation (luni-solar + planetary).
**
**  8)  The matrix rbpn transforms vectors from GCRS to true equator and
**      equinox of date.  It is the product rn x rbp, applying frame
**      bias, precession and nutation in that order.
**
**  9)  The X,Y,Z coordinates of the Celestial Intermediate Pole are
**      elements (3,1-3) of the GCRS-to-true matrix, i.e. rbpn[2][0-2].
**
**  10) It is permissible to re-use the same array in the returned
**      arguments.  The arrays are filled in the stated order.
**
**  Called:
**     iauPfw06     bias-precession F-W angles, IAU 2006
**     iauFw2m      F-W angles to r-matrix
**     iauCr        copy r-matrix
**     iauTr        transpose r-matrix
**     iauRxr       product of two r-matrices
**
**  References:
**
**     Capitaine, N. & Wallace, P.T., 2006, Astron.Astrophys. 450, 855
**
**     Wallace, P.T. & Capitaine, N., 2006, Astron.Astrophys. 459, 981
**
**  This revision:  2021 May 11
**
**  SOFA release 2021-05-12
**
**  Copyright (C) 2021 IAU SOFA Board.  See notes at end.
*/
{
   double gamb, phib, psib, eps, r1[3][3], r2[3][3], rt[3][3];


/* Bias-precession Fukushima-Williams angles of J2000.0 = frame bias. */
   iauPfw06(DJM0, DJM00, &gamb, &phib, &psib, &eps);

/* B matrix. */
   iauFw2m(gamb, phib, psib, eps, r1);
   iauCr(r1, rb);

/* Bias-precession Fukushima-Williams angles of date. */
   iauPfw06(date1, date2, &gamb, &phib, &psib, &eps);

/* Bias-precession matrix. */
   iauFw2m(gamb, phib, psib, eps, r2);
   iauCr(r2, rbp);

/* Solve for precession matrix. */
   iauTr(r1, rt);
   iauRxr(r2, rt, rp);

/* Equinox-based bias-precession-nutation matrix. */
   iauFw2m(gamb, phib, psib + dpsi, eps + deps, r1);
   iauCr(r1, rbpn);

/* Solve for nutation matrix. */
   iauTr(r2, rt);
   iauRxr(r1, rt, rn);

/* Obliquity, mean of date. */
   *epsa = eps;

/* Finished. */

/*----------------------------------------------------------------------
**
**  Copyright (C) 2021
**  Standards Of Fundamental Astronomy Board
**  of the International Astronomical Union.
**
**  =====================
**  SOFA Software License
**  =====================
**
**  NOTICE TO USER:
**
**  BY USING THIS SOFTWARE YOU ACCEPT THE FOLLOWING SIX TERMS AND
**  CONDITIONS WHICH APPLY TO ITS USE.
**
**  1. The Software is owned by the IAU SOFA Board ("SOFA").
**
**  2. Permission is granted to anyone to use the SOFA software for any
**     purpose, including commercial applications, free of charge and
**     without payment of royalties, subject to the conditions and
**     restrictions listed below.
**
**  3. You (the user) may copy and distribute SOFA source code to others,
**     and use and adapt its code and algorithms in your own software,
**     on a world-wide, royalty-free basis.  That portion of your
**     distribution that does not consist of intact and unchanged copies
**     of SOFA source code files is a "derived work" that must comply
**     with the following requirements:
**
**     a) Your work shall be marked or carry a statement that it
**        (i) uses routines and computations derived by you from
**        software provided by SOFA under license to you; and
**        (ii) does not itself constitute software provided by and/or
**        endorsed by SOFA.
**
**     b) The source code of your derived work must contain descriptions
**        of how the derived work is based upon, contains and/or differs
**        from the original SOFA software.
**
**     c) The names of all routines in your derived work shall not
**        include the prefix "iau" or "sofa" or trivial modifications
**        thereof such as changes of case.
**
**     d) The origin of the SOFA components of your derived work must
**        not be misrepresented;  you must not claim that you wrote the
**        original software, nor file a patent application for SOFA
**        software or algorithms embedded in the SOFA software.
**
**     e) These requirements must be reproduced intact in any source
**        distribution and shall apply to anyone to whom you have
**        granted a further right to modify the source code of your
**        derived work.
**
**     Note that, as originally distributed, the SOFA software is
**     intended to be a definitive implementation of the IAU standards,
**     and consequently third-party modifications are discouraged.  All
**     variations, no matter how minor, must be explicitly marked as
**     such, as explained above.
**
**  4. You shall not cause the SOFA software to be brought into
**     disrepute, either by misuse, or use for inappropriate tasks, or
**     by inappropriate modification.
**
**  5. The SOFA software is provided "as is" and SOFA makes no warranty
**     as to its use or performance.   SOFA does not and cannot warrant
**     the performance or results which the user may obtain by using the
**     SOFA software.  SOFA makes no warranties, express or implied, as
**     to non-infringement of third party rights, merchantability, or
**     fitness for any particular purpose.  In no event will SOFA be
**     liable to the user for any consequential, incidental, or special
**     damages, including any lost profits or lost savings, even if a
**     SOFA representative has been advised of such damages, or for any
**     claim by any third party.
**
**  6. The provision of any version of the SOFA software under the terms
**     and conditions specified herein does not imply that future
**     versions will also be made available under the same terms and
**     conditions.
*
**  In any published work or commercial product which uses the SOFA
**  software directly, acknowledgement (see www.iausofa.org) is
**  appreciated.
**
**  Correspondence concerning SOFA software should be addressed as
**  follows:
**
**      By email:  sofa@ukho.gov.uk
**      By post:   IAU SOFA Center
**                 HM Nautical Almanac Office
**                 UK Hydrographic Office
**                 Admiralty Way, Taunton
**                 Somerset, TA1 2DN
**                 United Kingdom
**
**--------------------------------------------------------------------*/
}